

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O1

void sysbvm_weakValueDictionary_increaseCapacity
               (sysbvm_context_t *context,sysbvm_weakValueDictionary_t **dictionary)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t value;
  sysbvm_tuple_t sVar3;
  anon_struct_32_4_a6c61186 gcFrame;
  ulong local_78;
  sysbvm_tuple_t sStack_70;
  sysbvm_weakValueAssociation_t *local_68;
  sysbvm_tuple_t sStack_60;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  undefined1 *puStack_40;
  
  puStack_40 = (undefined1 *)&local_78;
  local_68 = (sysbvm_weakValueAssociation_t *)0x0;
  sStack_60 = 0;
  sStack_70 = 0;
  local_78 = (*dictionary)->storage;
  local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_58._12_4_ = 0;
  local_48 = 4;
  sysbvm_stackFrame_pushRecord(&local_58);
  if ((local_78 & 0xf) == 0 && local_78 != 0) {
    uVar1 = (ulong)(*(uint *)(local_78 + 0xc) >> 3);
  }
  else {
    uVar1 = 0;
  }
  uVar2 = (ulong)(uint)((int)uVar1 * 2);
  sVar3 = 8;
  if (8 < uVar2) {
    sVar3 = uVar2;
  }
  sStack_70 = sysbvm_array_create(context,sVar3);
  (*dictionary)->storage = sStack_70;
  if (uVar1 == 0) {
    value = 0;
  }
  else {
    uVar2 = 0;
    value = 0;
    do {
      local_68 = *(sysbvm_weakValueAssociation_t **)(local_78 + 0x10 + uVar2 * 8);
      if ((local_68 != (sysbvm_weakValueAssociation_t *)0x0) && (local_68->value != 0x4f)) {
        sStack_60 = local_68->key;
        sysbvm_dictionary_insertNoCheck(context,dictionary,&local_68,&sStack_60);
        value = value + 1;
      }
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  if (value + 0x800000000000000 >> 0x3c == 0) {
    sVar3 = value << 4 | 0xb;
  }
  else {
    sVar3 = sysbvm_tuple_uint64_encodeBig(context,value);
  }
  (*dictionary)->size = sVar3;
  return;
}

Assistant:

static void sysbvm_weakValueDictionary_increaseCapacity(sysbvm_context_t *context, sysbvm_weakValueDictionary_t **dictionary)
{
    struct {
        sysbvm_array_t *oldStorage;
        sysbvm_array_t *newStorage;
        sysbvm_weakValueAssociation_t *association;
        sysbvm_tuple_t key;
    } gcFrame = {
        .oldStorage = (sysbvm_array_t*)(*dictionary)->storage,
    };
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    size_t oldCapacity = sysbvm_tuple_getSizeInSlots((sysbvm_tuple_t)gcFrame.oldStorage);
    size_t newCapacity = oldCapacity * 2;
    size_t newSize = 0;
    if(newCapacity < 8)
        newCapacity = 8;

    // Make the new storage.
    gcFrame.newStorage = (sysbvm_array_t*)sysbvm_array_create(context, newCapacity);
    (*dictionary)->storage = (sysbvm_tuple_t)gcFrame.newStorage;

    // Reinsert the old elements.
    for(size_t i = 0; i < oldCapacity; ++i)
    {
        gcFrame.association = (sysbvm_weakValueAssociation_t *)gcFrame.oldStorage->elements[i];
        if(gcFrame.association && gcFrame.association->value != SYSBVM_TOMBSTONE_TUPLE)
        {
            gcFrame.key = gcFrame.association->key;
            sysbvm_dictionary_insertNoCheck(context, dictionary, &gcFrame.association, &gcFrame.key);
            ++newSize;
        }
    }

    // We need to recompute the size due to deleted weak objects.
    (*dictionary)->size = sysbvm_tuple_size_encode(context, newSize);
}